

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayDropIndex(WriteAheadLogDeserializer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  DropInfo info;
  
  DropInfo::DropInfo(&info);
  info.super_ParseInfo._9_1_ = 4;
  Deserializer::ReadProperty<std::__cxx11::string>
            (&bStack_b8,&(this->deserializer).super_Deserializer,0x65,"schema");
  ::std::__cxx11::string::operator=((string *)&info.schema,(string *)&bStack_b8);
  ::std::__cxx11::string::~string((string *)&bStack_b8);
  Deserializer::ReadProperty<std::__cxx11::string>
            (&bStack_b8,&(this->deserializer).super_Deserializer,0x66,"name");
  ::std::__cxx11::string::operator=((string *)&info.name,(string *)&bStack_b8);
  ::std::__cxx11::string::~string((string *)&bStack_b8);
  if (this->deserialize_only == false) {
    Catalog::DropEntry(this->catalog,this->context,&info);
  }
  DropInfo::~DropInfo(&info);
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayDropIndex() {
	DropInfo info;
	info.type = CatalogType::INDEX_ENTRY;
	info.schema = deserializer.ReadProperty<string>(101, "schema");
	info.name = deserializer.ReadProperty<string>(102, "name");
	if (DeserializeOnly()) {
		return;
	}

	catalog.DropEntry(context, info);
}